

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateTypeInfo::Copy(CreateTypeInfo *this)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  bind_logical_type_function_t p_Var2;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var3;
  CreateTypeInfo *this_00;
  type other;
  pointer pCVar4;
  pointer pSVar5;
  pointer *__ptr;
  pointer in_RSI;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_28;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_20;
  
  this_00 = (CreateTypeInfo *)operator_new(0x170);
  CreateTypeInfo(this_00);
  local_28._M_head_impl = this_00;
  other = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
          operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                     *)&local_28);
  CreateInfo::CopyProperties(&in_RSI->super_CreateInfo,&other->super_CreateInfo);
  pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&pCVar4->name);
  pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_28);
  if (pCVar4 != in_RSI) {
    (pCVar4->type).id_ = (in_RSI->type).id_;
    (pCVar4->type).physical_type_ = (in_RSI->type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(pCVar4->type).type_info_,&(in_RSI->type).type_info_);
  }
  if ((in_RSI->query).
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl != (SQLStatement *)0x0) {
    pSVar5 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(&in_RSI->query);
    (*pSVar5->_vptr_SQLStatement[3])(&local_20,pSVar5);
    pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                         *)&local_28);
    _Var3._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (SQLStatement *)0x0;
    _Var1._M_head_impl =
         (pCVar4->query).
         super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (pCVar4->query).
    super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (SQLStatement *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_SQLStatement + 8))();
      if (local_20._M_head_impl != (SQLStatement *)0x0) {
        (*(local_20._M_head_impl)->_vptr_SQLStatement[1])();
      }
    }
  }
  p_Var2 = in_RSI->bind_function;
  pCVar4 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_28);
  pCVar4->bind_function = p_Var2;
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateTypeInfo::Copy() const {
	auto result = make_uniq<CreateTypeInfo>();
	CopyProperties(*result);
	result->name = name;
	result->type = type;
	if (query) {
		result->query = query->Copy();
	}
	result->bind_function = bind_function;
	return std::move(result);
}